

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_memory.c
# Opt level: O2

SUNMemory SUNMemoryHelper_Wrap(void *ptr,SUNMemoryType mem_type)

{
  SUNMemory __ptr;
  
  __ptr = SUNMemoryNewEmpty();
  __ptr->ptr = ptr;
  __ptr->own = 0;
  switch(mem_type) {
  case SUNMEMTYPE_HOST:
    __ptr->type = SUNMEMTYPE_HOST;
    break;
  case SUNMEMTYPE_PINNED:
    __ptr->type = SUNMEMTYPE_PINNED;
    break;
  case SUNMEMTYPE_DEVICE:
    __ptr->type = SUNMEMTYPE_DEVICE;
    break;
  case SUNMEMTYPE_UVM:
    __ptr->type = SUNMEMTYPE_UVM;
    break;
  default:
    free(__ptr);
    __ptr = (SUNMemory)0x0;
  }
  return __ptr;
}

Assistant:

SUNMemory SUNMemoryHelper_Wrap(void* ptr, SUNMemoryType mem_type)
{
  SUNMemory mem = SUNMemoryNewEmpty();

  mem->ptr = ptr;
  mem->own = SUNFALSE;

  switch(mem_type)
  {
    case SUNMEMTYPE_HOST:
      mem->type = SUNMEMTYPE_HOST;
      break;
    case SUNMEMTYPE_PINNED:
      mem->type = SUNMEMTYPE_PINNED;
      break;
    case SUNMEMTYPE_DEVICE:
      mem->type = SUNMEMTYPE_DEVICE;
      break;
    case SUNMEMTYPE_UVM:
      mem->type = SUNMEMTYPE_UVM;
      break;
    default:
      free(mem);
      SUNDIALS_DEBUG_PRINT("ERROR in SUNMemoryHelper_Wrap: unknown memory type\n");
      return(NULL);
  }

  return(mem);
}